

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sprites.c
# Opt level: O2

void ff4_edge(dw_rom *rom)

{
  ulong in_stack_fffffffffffffd68;
  undefined8 in_stack_fffffffffffffd70;
  ulong in_stack_fffffffffffffd78;
  undefined8 in_stack_fffffffffffffd80;
  ulong in_stack_fffffffffffffd88;
  undefined8 in_stack_fffffffffffffd90;
  ulong in_stack_fffffffffffffd98;
  undefined8 in_stack_fffffffffffffda0;
  ulong in_stack_fffffffffffffda8;
  undefined8 in_stack_fffffffffffffdb0;
  ulong in_stack_fffffffffffffdb8;
  undefined8 in_stack_fffffffffffffdc0;
  ulong in_stack_fffffffffffffdc8;
  undefined8 in_stack_fffffffffffffdd0;
  ulong in_stack_fffffffffffffdd8;
  undefined8 in_stack_fffffffffffffde0;
  ulong in_stack_fffffffffffffde8;
  undefined8 in_stack_fffffffffffffdf0;
  ulong in_stack_fffffffffffffdf8;
  undefined8 in_stack_fffffffffffffe00;
  ulong in_stack_fffffffffffffe08;
  undefined8 in_stack_fffffffffffffe10;
  ulong in_stack_fffffffffffffe18;
  undefined8 in_stack_fffffffffffffe20;
  ulong in_stack_fffffffffffffe28;
  undefined8 in_stack_fffffffffffffe30;
  ulong in_stack_fffffffffffffe38;
  undefined8 in_stack_fffffffffffffe40;
  ulong in_stack_fffffffffffffe48;
  undefined8 in_stack_fffffffffffffe50;
  ulong in_stack_fffffffffffffe58;
  undefined8 in_stack_fffffffffffffe60;
  ulong in_stack_fffffffffffffe68;
  undefined8 in_stack_fffffffffffffe70;
  ulong in_stack_fffffffffffffe78;
  undefined8 in_stack_fffffffffffffe80;
  ulong in_stack_fffffffffffffe88;
  undefined8 in_stack_fffffffffffffe90;
  ulong in_stack_fffffffffffffe98;
  undefined8 in_stack_fffffffffffffea0;
  ulong in_stack_fffffffffffffea8;
  undefined8 in_stack_fffffffffffffeb0;
  ulong in_stack_fffffffffffffeb8;
  undefined8 in_stack_fffffffffffffec0;
  ulong in_stack_fffffffffffffec8;
  undefined8 in_stack_fffffffffffffed0;
  ulong in_stack_fffffffffffffed8;
  undefined8 in_stack_fffffffffffffee0;
  ulong in_stack_fffffffffffffee8;
  undefined8 in_stack_fffffffffffffef0;
  ulong in_stack_fffffffffffffef8;
  undefined8 in_stack_ffffffffffffff00;
  ulong in_stack_ffffffffffffff08;
  undefined8 in_stack_ffffffffffffff10;
  ulong in_stack_ffffffffffffff18;
  undefined8 in_stack_ffffffffffffff20;
  ulong in_stack_ffffffffffffff28;
  undefined8 in_stack_ffffffffffffff30;
  ulong in_stack_ffffffffffffff38;
  undefined8 in_stack_ffffffffffffff40;
  ulong in_stack_ffffffffffffff48;
  undefined8 in_stack_ffffffffffffff50;
  undefined8 uVar1;
  
  vpatch(rom,0x13b4,0x4f,0x50,0,0x51,in_stack_fffffffffffffd68 & 0xffffffff00000000,
         CONCAT44((int)((ulong)in_stack_fffffffffffffd70 >> 0x20),0x52),
         in_stack_fffffffffffffd78 & 0xffffffff00000000,
         CONCAT44((int)((ulong)in_stack_fffffffffffffd80 >> 0x20),0x53),
         in_stack_fffffffffffffd88 & 0xffffffff00000000,
         CONCAT44((int)((ulong)in_stack_fffffffffffffd90 >> 0x20),0x54),
         in_stack_fffffffffffffd98 & 0xffffffff00000000,
         CONCAT44((int)((ulong)in_stack_fffffffffffffda0 >> 0x20),0x55),
         in_stack_fffffffffffffda8 & 0xffffffff00000000,
         CONCAT44((int)((ulong)in_stack_fffffffffffffdb0 >> 0x20),0x56),
         in_stack_fffffffffffffdb8 & 0xffffffff00000000,
         CONCAT44((int)((ulong)in_stack_fffffffffffffdc0 >> 0x20),0x57),
         in_stack_fffffffffffffdc8 & 0xffffffff00000000,
         CONCAT44((int)((ulong)in_stack_fffffffffffffdd0 >> 0x20),0x50),
         in_stack_fffffffffffffdd8 & 0xffffffff00000000,
         CONCAT44((int)((ulong)in_stack_fffffffffffffde0 >> 0x20),0x51),
         in_stack_fffffffffffffde8 & 0xffffffff00000000,
         CONCAT44((int)((ulong)in_stack_fffffffffffffdf0 >> 0x20),0x52),
         in_stack_fffffffffffffdf8 & 0xffffffff00000000,
         CONCAT44((int)((ulong)in_stack_fffffffffffffe00 >> 0x20),0x53),
         in_stack_fffffffffffffe08 & 0xffffffff00000000,
         CONCAT44((int)((ulong)in_stack_fffffffffffffe10 >> 0x20),0x54),
         in_stack_fffffffffffffe18 & 0xffffffff00000000,
         CONCAT44((int)((ulong)in_stack_fffffffffffffe20 >> 0x20),0x55),
         in_stack_fffffffffffffe28 & 0xffffffff00000000,
         CONCAT44((int)((ulong)in_stack_fffffffffffffe30 >> 0x20),0x56),
         in_stack_fffffffffffffe38 & 0xffffffff00000000,
         CONCAT44((int)((ulong)in_stack_fffffffffffffe40 >> 0x20),0x57),
         in_stack_fffffffffffffe48 & 0xffffffff00000000,
         CONCAT44((int)((ulong)in_stack_fffffffffffffe50 >> 0x20),0x50),
         in_stack_fffffffffffffe58 & 0xffffffff00000000,
         CONCAT44((int)((ulong)in_stack_fffffffffffffe60 >> 0x20),0x51),
         in_stack_fffffffffffffe68 & 0xffffffff00000000,
         CONCAT44((int)((ulong)in_stack_fffffffffffffe70 >> 0x20),0x52),
         in_stack_fffffffffffffe78 & 0xffffffff00000000,
         CONCAT44((int)((ulong)in_stack_fffffffffffffe80 >> 0x20),0x53),
         in_stack_fffffffffffffe88 & 0xffffffff00000000,
         CONCAT44((int)((ulong)in_stack_fffffffffffffe90 >> 0x20),0x54),
         in_stack_fffffffffffffe98 & 0xffffffff00000000,
         CONCAT44((int)((ulong)in_stack_fffffffffffffea0 >> 0x20),0x55),
         in_stack_fffffffffffffea8 & 0xffffffff00000000,
         CONCAT44((int)((ulong)in_stack_fffffffffffffeb0 >> 0x20),0x56),
         in_stack_fffffffffffffeb8 & 0xffffffff00000000,
         CONCAT44((int)((ulong)in_stack_fffffffffffffec0 >> 0x20),0x57),
         in_stack_fffffffffffffec8 & 0xffffffff00000000,
         CONCAT44((int)((ulong)in_stack_fffffffffffffed0 >> 0x20),0x50),
         in_stack_fffffffffffffed8 & 0xffffffff00000000,
         CONCAT44((int)((ulong)in_stack_fffffffffffffee0 >> 0x20),0x51),
         in_stack_fffffffffffffee8 & 0xffffffff00000000,
         CONCAT44((int)((ulong)in_stack_fffffffffffffef0 >> 0x20),0x52),
         in_stack_fffffffffffffef8 & 0xffffffff00000000,
         CONCAT44((int)((ulong)in_stack_ffffffffffffff00 >> 0x20),0x53),
         in_stack_ffffffffffffff08 & 0xffffffff00000000,
         CONCAT44((int)((ulong)in_stack_ffffffffffffff10 >> 0x20),0x54),
         in_stack_ffffffffffffff18 & 0xffffffff00000000,
         CONCAT44((int)((ulong)in_stack_ffffffffffffff20 >> 0x20),0x55),
         in_stack_ffffffffffffff28 & 0xffffffff00000000,
         CONCAT44((int)((ulong)in_stack_ffffffffffffff30 >> 0x20),0x56),
         in_stack_ffffffffffffff38 & 0xffffffff00000000,
         CONCAT44((int)((ulong)in_stack_ffffffffffffff40 >> 0x20),0x57),
         in_stack_ffffffffffffff48 & 0xffffffff00000000,
         CONCAT44((int)((ulong)in_stack_ffffffffffffff50 >> 0x20),0xb8));
  vpatch(rom,0x14b4,0xf,0x48,0,0x49,0,0x4a,0,0x4b,0,0x4c,0,0x4d,0,0x4e,0,0x4f);
  vpatch(rom,0x14d4,0xf,0x48,0,0x49,0,0x4a,0,0x4b,0,0x4c,0,0x4d,0,0x4e,0,0x4f);
  vpatch(rom,0x14f4,0xf,0x98,0,0x99,3,0x9a,0,0x9b,3,0x9c,0,0x9d,3,0x9e,0,0x9f);
  vpatch(rom,0x15b4,0x43,0x30,0,0x31,0,0x32,0,0x33,0,0x34,0,0x35,0,0x36,0,0x37,0,0x30,0,0x31,0,0x32,
         0,0x33,0,0x34,0,0x35,0,0x36,0,0x37,0,0x30,0,0x31,0,0x32,0,0x33,0,0x34,0,0x35,0,0x36,0,0x37,
         0,0x30,0,0x31,0,0x32,0,0x33,0,0x34,0,0x35,0,0x36,0,0x37,0,0xb0);
  vpatch(rom,0x16b4,0x4f,0x40,0,0x41,0,0x42,0,0x43,0,0x44,0,0x45,0,0x46,0,0x47,0,0x40,0,0x41,0,0x42,
         0,0x43,0,0x44,0,0x45,0,0x46,0,0x47,0,0x40,0,0x41,0,0x42,0,0x43,0,0x44,0,0x45,0,0x46,0,0x47,
         0,0x40,0,0x41,0,0x42,0,0x43,0,0x44,0,0x45,0,0x46,0,0x47,0,0xa8);
  vpatch(rom,0x12006,2,7,0x18);
  vpatch(rom,0x1200e,0x32,0xf,0xf,7,0xf,0xf,0x1f,0xe,0x1a,2,0x18,7,0xf,0xf,0x1f,0xf,0x1f,0xf,0xf,
         0x3f,0x7f,0x7f,0x1f,0x1f,0xe,0,0,0x27,0x60,0x60,0x60,0x61,0xe,0xe,0,0xf8,0xfc,0xfe,0xf8,
         0xf8,0xf0,0xf0,0,0xe6,6,6,0,0x80,0xf0,0xf0,0xf0);
  vpatch(rom,0x12047,1,3);
  vpatch(rom,0x1204f,0x30,4,0xe0,0xf0,0xf8,0xf8,0xe8,0xa0,0x20,0x80,0xe0,0xf0,0xf8,0xf8,0xf8,0xf0,
         0xf0,0xe0,7,0xf,0xf,0xf,0xf,0xf,0xf,0,3,3,1,0,8,0xf,0xf,0xf,0xe0,0x90,0x98,0xf8,0xf8,0x70,0
         ,0,0x60,0xf0,0xf8,0,0x18,0x70,0x70);
  vpatch(rom,0x120a0,0x20,0x1e,0x1f,0x7f,0x1f,0x1f,0xe,0,0,0x67,99,99,0,3,0xe,0xe,0,0x7c,0xfe,0xfe,
         0xf8,0xf8,0xf0,0xf0,0,0xe4,0xc6,0xc6,6,0xc6,0xf0,0xf0,0xf0);
  vpatch(rom,0x120d1,0x2f,0xf,0xf,0x1f,0x1e,0x1a,0x12,0x18,7,0xc,0xb,0x1f,0x1f,0x1f,0x1f,0x1f,0x1f,
         0x1f,0xf,0xf,0xf,0x1f,0x3f,0x3f,0xf,0x27,0x30,0x30,0x3f,0x1f,0x3f,0x3f,0xf8,0xf8,0xf0,0xf0,
         0xf0,0xf0,0xf8,0x8c,0xf4,0xe4,0,0,0xf0,0xf0,0xf8,0xfc);
  vpatch(rom,0x12106,1,0x3e);
  vpatch(rom,0x1210e,0x2e,0x3f,0x3f,0xc0,0xe0,0xf0,0xf0,0xc0,0x40,0x40,0,0xc0,0x80,0x70,0xf0,0xe0,
         0xe0,0xe0,0xe0,0x1f,0x1c,0xe,0xf,0xf,0x1f,0x3f,0x71,0x1c,0x1b,1,0,0xf,0x1f,0x3f,0x7f,0,0x20
         ,0x60,0xe0,0xf0,0xf0,0xf8,0xf8,0xc0,0xe0,0xa0,0x20);
  vpatch(rom,0x12200,0x20,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0);
  uVar1 = 0;
  vpatch(rom,0x12240,0x5f,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,
         0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0);
  vpatch(rom,0x12300,0x80,0xb,0x1f,0x1f,0x1f,0x18,0x9e,0xcb,0x7a,0xb,0x14,0x10,0x10,0x17,0x17,0x8f,
         0x4f,0xe0,0xf0,0xf4,0xf8,0x8a,0x3c,0x68,0x58,0x40,0x10,0x14,8,0x7a,0xfc,0xf8,0xe8,0x3f,0x6f
         ,0x7f,0xdf,0xdf,0xf9,0xfc,0x7c,0x30,0x5e,0x59,0xbc,0xb9,0xbf,0xbf,0x7f,0xfc,0xfe,0xf2,0xf3,
         0xff,0x9f,0xbf,0xe0,0xc,0x3e,0xce,0x1d,0x3d,0xfe,0xfe,0xe0,0xb);
  vpatch(rom,0x12400,0x180,0x1f,0xff,0x7f,0x7f,0x3f,0x39,0x2a,0x3e,0x1f,0xa0,0x40,0x40,0x2c,0x3e,
         0x3d,0x21,0xc0,0xe0,0xf0,0xe0,0xe0,0xe6,0xce,0xfc,0xc0,0x20,0x10,0x20,0x20,0x22,0x42,100,
         0x3f,0x1f,0xf,0xf,0xf,4,4,8,0x23,0x1c,9,9,0xb,7,7,0xf,0xf8,0xe0,0x70,0x38,0xb8,0xbc,0xfc,
         0xff,0xd8,0xa0,0xd0,200,0xe8,0xa4,0xe4,0xff,0x1f);
  vpatch(rom,0x12600,0x10,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,uVar1);
  vpatch(rom,0x12620,0xf,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0);
  vpatch(rom,0x12640,0x10,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0);
  vpatch(rom,0x12660,0x10,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0);
  vpatch(rom,0x12710,0x10,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0);
  vpatch(rom,0x12730,0x10,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0);
  vpatch(rom,0x12750,0x10,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0);
  vpatch(rom,0x12770,0xf,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0);
  vpatch(rom,0x12800,0x10,0x60,0x10,0x60,0x20,0xf0,0xf0,0xfc,0xfe,0xe0,0xf4,0xfc,0xf8,0xf0,0xd0,0x4c
         ,0x1e);
  vpatch(rom,0x12820,0xf,0xff,0xff,0x2f,0,0x1f,0x1e,0xe,0,0x9e,0x9f,0x6f,0x4f,0x1f,0x1e,0);
  vpatch(rom,0x12840,0x10,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0);
  vpatch(rom,0x12860,0x10,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0);
  vpatch(rom,0x12920,0xd,0x1e,0x33,0xf3,0x7e,0x7c,0xfc,0xfe,0xff,0xf2,0xef,0xdf,0xbe,0xbc);
  vpatch(rom,0x12950,0x10,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0);
  vpatch(rom,0x12970,0x90,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0x3f,0x7f,0x3f,0x3b,0x39,0x15,0x17,0x3f,
         0x3f,0x40,0x20,0x27,0x27,0x1b,0x18,0x3c,0x3c,0x7e,0xff,0xff,0xff,0xff,0xff,0xff,0x7e,0xff,
         0xff,0xff,0xff,0xff,0xff,0xff,0x7e,0x7e,0xfe,0xef,0xff,0xd3,0xf3,0xf1,0x53,0x69,0x99,0xa9,
         0x3c,0x5f,0x7f,0xff,0xff);
  vpatch(rom,0x12a20,0x120,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0
         ,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0);
  vpatch(rom,0x12b4b,0xb5,0xfb,0xfb,0xf5,0xe5,0xc5,0xe0,0xf0,0xf4,0xf8,0x8a,0x3c,0x68,0x58,0x40,0x10
         ,0x14,8,0x7a,0xfc,0xf8,0xe8,0xff,0xcf,7,4,0xf,0x3f,2,0,0xe0,0xf9,0x7f,0x7f,0x39,1,1,1,0xc1,
         0xc1,0x30,0x88,0x44,0x24,0x24,0x24,0xfe,0xff,0xff,0xff,0xff,0xff,0xff,0xff,0xf,0x2f,0x5f,
         0x3f,0xdf,0xef,0x7f,0x3f,0xb,0x28,0x50,0x30);
  vpatch(rom,0x12c44,0x4e,0x3f,0x7f,0x7f,0x7f,0x38,0x3c,0x1f,0x1f,0xf,0x10,0x10,0x48,0x3e,0x79,0xf7,
         0xf1,0xf9,0xfd,0xff,0xfe,0x38,0x7a,0xf0,0xf0,0xe0,0x10,0x10,0x24,0x7f,0xff,0xff,0x3f,0x3f,
         0x3f,0x7f,0xff,100,0xff,0xff,0xff,0xff,0x3f,0x7f,0xff,0xfc,0xfe,0xfe,0xfa,0xfa,0xfa,0xfe,
         0x86,0x4f,0xff,0xfe,0xf8,0xf8,0xf8,0xfc,0xfe,0x38,0x7e,0xf1,0xf7,0xf9);
  vpatch(rom,0x12c97,3,0xe1,0xe4,0xff);
  vpatch(rom,0x12c9f,0x23,0xff,0xfe,0xfc,0xfe,0xfe,0xfa,0xfa,0xfe,0xfe,0x4c,0xff,0xff,0xfe,0xf8,0xf8
         ,0xfc,0xfe,0x80,0xc0,0xe0,0xb0,0x90,0xe0,0xe0,0x80,0,0x40,0x60,0xf0,0xf0,0x50,0x70,0x70,0xe
         ,0xe);
  vpatch(rom,76999,3,0x61,1,0xf);
  vpatch(rom,0x12ccf,0x34,0x7f,0x50,0x60,0xf0,0xf0,0xf0,0xf0,0xf8,0xf8,0xf0,0xb0,0x50,0x68,0x68,0x70
         ,0x78,0xf8,0xf,7,3,7,0x1f,0x3f,0x3f,0x1f,0xf,7,2,6,6,0x16,0xe,3,0,0xc0,0xe0,0xb0,0x90,0x60,
         0xe0,0x80,0,0x40,0x60,0x70,0xf0,0xd0,0x70,0x70,0xf,0xe,0x1e);
  vpatch(rom,0x12d08,3,0,0xf,0x1f);
  vpatch(rom,0x12d10,0x70,0xc0,0x60,0x70,0xf0,0xf0,0xf0,0xf8,0x88,0x70,0xb0,0xd0,0x68,0x68,0x70,0x78
         ,0x78,0x7c,0x9e,0xef,0x8d,0x9c,0xbb,0xfb,0x7c,0x1c,0x5e,0xf,0xf,7,0x1e,0xf,7,0x1c,0x3c,0xf8
         ,0xd8,0x9c,0x6e,0x6e,0x1e,0x1c,0x3c,0xf8,0xf8,0xf0,0xbc,0xf8,0xf0,0x3d,0x3e,0x5f,0x5f,0x5f,
         0x5f,0x7f,0x7f,0xe7,0xfb,0x1d,0x1e,0x1e,0x1f,0x3f,0x7f,0xde);
  set_palette_colors(rom,'\0','\x01','5','\x0f');
  return;
}

Assistant:

static void ff4_edge(dw_rom *rom)
{
    vpatch(rom, 0x013b4,   79, 
        0x50, 0x00, 0x51, 0x00, 0x52, 0x00, 0x53, 0x00, 0x54, 0x00, 0x55, 0x00,
        0x56, 0x00, 0x57, 0x00, 0x50, 0x00, 0x51, 0x00, 0x52, 0x00, 0x53, 0x00,
        0x54, 0x00, 0x55, 0x00, 0x56, 0x00, 0x57, 0x00, 0x50, 0x00, 0x51, 0x00,
        0x52, 0x00, 0x53, 0x00, 0x54, 0x00, 0x55, 0x00, 0x56, 0x00, 0x57, 0x00,
        0x50, 0x00, 0x51, 0x00, 0x52, 0x00, 0x53, 0x00, 0x54, 0x00, 0x55, 0x00,
        0x56, 0x00, 0x57, 0x00, 0xb8, 0x00, 0xb9, 0x00, 0xba, 0x00, 0xbb, 0x00,
        0xbc, 0x00, 0xbd, 0x00, 0xbe, 0x00, 0xbf);
    vpatch(rom, 0x014b4,   15, 
        0x48, 0x00, 0x49, 0x00, 0x4a, 0x00, 0x4b, 0x00, 0x4c, 0x00, 0x4d, 0x00,
        0x4e, 0x00, 0x4f);
    vpatch(rom, 0x014d4,   15, 
        0x48, 0x00, 0x49, 0x00, 0x4a, 0x00, 0x4b, 0x00, 0x4c, 0x00, 0x4d, 0x00,
        0x4e, 0x00, 0x4f);
    vpatch(rom, 0x014f4,   15, 
        0x98, 0x00, 0x99, 0x03, 0x9a, 0x00, 0x9b, 0x03, 0x9c, 0x00, 0x9d, 0x03,
        0x9e, 0x00, 0x9f);
    vpatch(rom, 0x015b4,   67, 
        0x30, 0x00, 0x31, 0x00, 0x32, 0x00, 0x33, 0x00, 0x34, 0x00, 0x35, 0x00,
        0x36, 0x00, 0x37, 0x00, 0x30, 0x00, 0x31, 0x00, 0x32, 0x00, 0x33, 0x00,
        0x34, 0x00, 0x35, 0x00, 0x36, 0x00, 0x37, 0x00, 0x30, 0x00, 0x31, 0x00,
        0x32, 0x00, 0x33, 0x00, 0x34, 0x00, 0x35, 0x00, 0x36, 0x00, 0x37, 0x00,
        0x30, 0x00, 0x31, 0x00, 0x32, 0x00, 0x33, 0x00, 0x34, 0x00, 0x35, 0x00,
        0x36, 0x00, 0x37, 0x00, 0xb0, 0x03, 0xb1);
    vpatch(rom, 0x016b4,   79, 
        0x40, 0x00, 0x41, 0x00, 0x42, 0x00, 0x43, 0x00, 0x44, 0x00, 0x45, 0x00,
        0x46, 0x00, 0x47, 0x00, 0x40, 0x00, 0x41, 0x00, 0x42, 0x00, 0x43, 0x00,
        0x44, 0x00, 0x45, 0x00, 0x46, 0x00, 0x47, 0x00, 0x40, 0x00, 0x41, 0x00,
        0x42, 0x00, 0x43, 0x00, 0x44, 0x00, 0x45, 0x00, 0x46, 0x00, 0x47, 0x00,
        0x40, 0x00, 0x41, 0x00, 0x42, 0x00, 0x43, 0x00, 0x44, 0x00, 0x45, 0x00,
        0x46, 0x00, 0x47, 0x00, 0xa8, 0x03, 0xa9, 0x00, 0xaa, 0x03, 0xab, 0x03,
        0xac, 0x03, 0xad, 0x00, 0xae, 0x03, 0xaf);
    vpatch(rom, 0x12006,    2, 
        0x07, 0x18);
    vpatch(rom, 0x1200e,   50, 
        0x0f, 0x0f, 0x07, 0x0f, 0x0f, 0x1f, 0x0e, 0x1a, 0x02, 0x18, 0x07, 0x0f,
        0x0f, 0x1f, 0x0f, 0x1f, 0x0f, 0x0f, 0x3f, 0x7f, 0x7f, 0x1f, 0x1f, 0x0e,
        0x00, 0x00, 0x27, 0x60, 0x60, 0x60, 0x61, 0x0e, 0x0e, 0x00, 0xf8, 0xfc,
        0xfe, 0xf8, 0xf8, 0xf0, 0xf0, 0x00, 0xe6, 0x06, 0x06, 0x00, 0x80, 0xf0,
        0xf0, 0xf0);
    vpatch(rom, 0x12047,    1,  0x03);
    vpatch(rom, 0x1204f,   48, 
        0x04, 0xe0, 0xf0, 0xf8, 0xf8, 0xe8, 0xa0, 0x20, 0x80, 0xe0, 0xf0, 0xf8,
        0xf8, 0xf8, 0xf0, 0xf0, 0xe0, 0x07, 0x0f, 0x0f, 0x0f, 0x0f, 0x0f, 0x0f,
        0x00, 0x03, 0x03, 0x01, 0x00, 0x08, 0x0f, 0x0f, 0x0f, 0xe0, 0x90, 0x98,
        0xf8, 0xf8, 0x70, 0x00, 0x00, 0x60, 0xf0, 0xf8, 0x00, 0x18, 0x70, 0x70);
    vpatch(rom, 0x120a0,   32, 
        0x1e, 0x1f, 0x7f, 0x1f, 0x1f, 0x0e, 0x00, 0x00, 0x67, 0x63, 0x63, 0x00,
        0x03, 0x0e, 0x0e, 0x00, 0x7c, 0xfe, 0xfe, 0xf8, 0xf8, 0xf0, 0xf0, 0x00,
        0xe4, 0xc6, 0xc6, 0x06, 0xc6, 0xf0, 0xf0, 0xf0);
    vpatch(rom, 0x120d1,   47, 
        0x0f, 0x0f, 0x1f, 0x1e, 0x1a, 0x12, 0x18, 0x07, 0x0c, 0x0b, 0x1f, 0x1f,
        0x1f, 0x1f, 0x1f, 0x1f, 0x1f, 0x0f, 0x0f, 0x0f, 0x1f, 0x3f, 0x3f, 0x0f,
        0x27, 0x30, 0x30, 0x3f, 0x1f, 0x3f, 0x3f, 0xf8, 0xf8, 0xf0, 0xf0, 0xf0,
        0xf0, 0xf8, 0x8c, 0xf4, 0xe4, 0x00, 0x00, 0xf0, 0xf0, 0xf8, 0xfc);
    vpatch(rom, 0x12106,    1,  0x3e);
    vpatch(rom, 0x1210e,   46, 
        0x3f, 0x3f, 0xc0, 0xe0, 0xf0, 0xf0, 0xc0, 0x40, 0x40, 0x00, 0xc0, 0x80,
        0x70, 0xf0, 0xe0, 0xe0, 0xe0, 0xe0, 0x1f, 0x1c, 0x0e, 0x0f, 0x0f, 0x1f,
        0x3f, 0x71, 0x1c, 0x1b, 0x01, 0x00, 0x0f, 0x1f, 0x3f, 0x7f, 0x00, 0x20,
        0x60, 0xe0, 0xf0, 0xf0, 0xf8, 0xf8, 0xc0, 0xe0, 0xa0, 0x20);
    vpatch(rom, 0x12200,   32, 
        0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
        0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
        0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00);
    vpatch(rom, 0x12240,   95, 
        0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
        0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
        0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
        0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
        0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
        0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
        0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
        0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00);
    vpatch(rom, 0x12300,  128, 
        0x0b, 0x1f, 0x1f, 0x1f, 0x18, 0x9e, 0xcb, 0x7a, 0x0b, 0x14, 0x10, 0x10,
        0x17, 0x17, 0x8f, 0x4f, 0xe0, 0xf0, 0xf4, 0xf8, 0x8a, 0x3c, 0x68, 0x58,
        0x40, 0x10, 0x14, 0x08, 0x7a, 0xfc, 0xf8, 0xe8, 0x3f, 0x6f, 0x7f, 0xdf,
        0xdf, 0xf9, 0xfc, 0x7c, 0x30, 0x5e, 0x59, 0xbc, 0xb9, 0xbf, 0xbf, 0x7f,
        0xfc, 0xfe, 0xf2, 0xf3, 0xff, 0x9f, 0xbf, 0xe0, 0x0c, 0x3e, 0xce, 0x1d,
        0x3d, 0xfe, 0xfe, 0xe0, 0x0b, 0x1f, 0x1f, 0x1f, 0x18, 0x9e, 0xcb, 0x7a,
        0x0b, 0x14, 0x10, 0x10, 0x17, 0x17, 0x8f, 0x4f, 0xe0, 0xf0, 0xf4, 0xf8,
        0x8a, 0x3c, 0x68, 0x58, 0x40, 0x10, 0x14, 0x08, 0x7a, 0xfc, 0xf8, 0xe8,
        0x3f, 0x7f, 0x4f, 0x4f, 0xff, 0xf9, 0xfd, 0x07, 0x30, 0x7e, 0x79, 0x7c,
        0xb9, 0x3f, 0x7f, 0x07, 0xfc, 0xf6, 0xfe, 0xfb, 0xfb, 0x9f, 0x1f, 0x3e,
        0x0c, 0x3a, 0xca, 0x1d, 0x3d, 0xfd, 0xfd, 0xfe);
    vpatch(rom, 0x12400,  384, 
        0x1f, 0xff, 0x7f, 0x7f, 0x3f, 0x39, 0x2a, 0x3e, 0x1f, 0xa0, 0x40, 0x40,
        0x2c, 0x3e, 0x3d, 0x21, 0xc0, 0xe0, 0xf0, 0xe0, 0xe0, 0xe6, 0xce, 0xfc,
        0xc0, 0x20, 0x10, 0x20, 0x20, 0x22, 0x42, 0x64, 0x3f, 0x1f, 0x0f, 0x0f,
        0x0f, 0x04, 0x04, 0x08, 0x23, 0x1c, 0x09, 0x09, 0x0b, 0x07, 0x07, 0x0f,
        0xf8, 0xe0, 0x70, 0x38, 0xb8, 0xbc, 0xfc, 0xff, 0xd8, 0xa0, 0xd0, 0xc8,
        0xe8, 0xa4, 0xe4, 0xff, 0x1f, 0xff, 0x7f, 0x7f, 0x3f, 0x39, 0x2a, 0x3e,
        0x1f, 0xa0, 0x40, 0x40, 0x2c, 0x3e, 0x3d, 0x21, 0xc0, 0xe0, 0xf0, 0xe0,
        0xe0, 0xe1, 0xcf, 0xfe, 0xc0, 0x20, 0x10, 0x20, 0x20, 0x20, 0x41, 0x66,
        0x3f, 0x4f, 0x4f, 0x3f, 0x1f, 0x2f, 0x4f, 0x8f, 0x23, 0x7c, 0x79, 0x31,
        0x1e, 0x32, 0x77, 0xff, 0xf8, 0x9c, 0xde, 0xcf, 0xf7, 0xd7, 0x12, 0xbf,
        0xd8, 0xec, 0x72, 0x79, 0xb1, 0x35, 0xf2, 0xff, 0x03, 0x07, 0x0f, 0x07,
        0x07, 0x67, 0x73, 0x3f, 0x03, 0x04, 0x08, 0x04, 0x04, 0x44, 0x42, 0x26,
        0xf8, 0xff, 0xfe, 0xfe, 0xfc, 0x9c, 0x54, 0x7c, 0xf8, 0x05, 0x02, 0x02,
        0x34, 0x7c, 0xbc, 0x84, 0x1f, 0x07, 0x0e, 0x1c, 0x1d, 0x3d, 0x3f, 0xff,
        0x1b, 0x05, 0x0b, 0x13, 0x17, 0x25, 0x27, 0xff, 0xfc, 0xf8, 0xf0, 0xf0,
        0xf0, 0x20, 0x20, 0x10, 0xc4, 0x38, 0x90, 0x90, 0xd0, 0xe0, 0xe0, 0xf0,
        0x03, 0x07, 0x0f, 0x07, 0x07, 0x87, 0xf3, 0x7f, 0x03, 0x04, 0x08, 0x04,
        0x04, 0x04, 0x82, 0x66, 0xf8, 0xff, 0xfe, 0xfe, 0xfc, 0x9c, 0x54, 0x7c,
        0xf8, 0x05, 0x02, 0x02, 0x34, 0x7c, 0xbc, 0x84, 0x1f, 0x39, 0x7b, 0xf3,
        0xef, 0xeb, 0x48, 0xfd, 0x1b, 0x37, 0x4e, 0x9e, 0x8d, 0xac, 0x4f, 0xff,
        0xfc, 0xf2, 0xf2, 0xfc, 0xf8, 0xf4, 0xf2, 0xf1, 0xc4, 0x3e, 0x9e, 0x8c,
        0x78, 0x4c, 0xee, 0xff, 0x07, 0x17, 0x2f, 0x1f, 0x6f, 0x77, 0x3f, 0x1f,
        0x05, 0x14, 0x28, 0x18, 0x48, 0x45, 0x25, 0x1a, 0xa0, 0xf0, 0xf0, 0xf0,
        0xf0, 0xf0, 0xf0, 0xfe, 0xa0, 0x50, 0x10, 0x10, 0x10, 0x10, 0xb0, 0x16,
        0x7f, 0x7f, 0xff, 0xff, 0xff, 0x7f, 0x3f, 0x1f, 0x43, 0x40, 0x80, 0x82,
        0x81, 0x40, 0x20, 0x1f, 0xfe, 0xfe, 0xff, 0xff, 0xff, 0xff, 0xff, 0xc6,
        0xe2, 0x02, 0x01, 0x01, 0xf1, 0x01, 0x01, 0xfe, 0x07, 0x17, 0x2f, 0x1f,
        0x6f, 0x77, 0x3f, 0x1f, 0x05, 0x14, 0x28, 0x18, 0x48, 0x45, 0x25, 0x1a,
        0xa0, 0xf0, 0xf0, 0xf0, 0xf0, 0xf0, 0xf0, 0xfe, 0xa0, 0x50, 0x10, 0x10,
        0x10, 0x10, 0xb0, 0x16, 0x7f, 0x7f, 0xff, 0xff, 0xff, 0xff, 0xff, 0x63,
        0x43, 0x40, 0x80, 0x80, 0x8f, 0x80, 0x9c, 0x7f, 0xfe, 0xfe, 0xff, 0xff,
        0xff, 0xfe, 0xfc, 0xfc, 0xe2, 0x02, 0x01, 0x41, 0x81, 0x02, 0x04, 0xfc);
    vpatch(rom, 0x12600,   16, 
        0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
        0x00, 0x00, 0x00, 0x00);
    vpatch(rom, 0x12620,   15, 
        0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
        0x00, 0x00, 0x00);
    vpatch(rom, 0x12640,   16, 
        0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
        0x00, 0x00, 0x00, 0x00);
    vpatch(rom, 0x12660,   16, 
        0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
        0x00, 0x00, 0x00, 0x00);
    vpatch(rom, 0x12710,   16, 
        0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
        0x00, 0x00, 0x00, 0x00);
    vpatch(rom, 0x12730,   16, 
        0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
        0x00, 0x00, 0x00, 0x00);
    vpatch(rom, 0x12750,   16, 
        0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
        0x00, 0x00, 0x00, 0x00);
    vpatch(rom, 0x12770,   15, 
        0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
        0x00, 0x00, 0x00);
    vpatch(rom, 0x12800,   16, 
        0x60, 0x10, 0x60, 0x20, 0xf0, 0xf0, 0xfc, 0xfe, 0xe0, 0xf4, 0xfc, 0xf8,
        0xf0, 0xd0, 0x4c, 0x1e);
    vpatch(rom, 0x12820,   15, 
        0xff, 0xff, 0x2f, 0x00, 0x1f, 0x1e, 0x0e, 0x00, 0x9e, 0x9f, 0x6f, 0x4f,
        0x1f, 0x1e, 0x00);
    vpatch(rom, 0x12840,   16, 
        0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
        0x00, 0x00, 0x00, 0x00);
    vpatch(rom, 0x12860,   16, 
        0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
        0x00, 0x00, 0x00, 0x00);
    vpatch(rom, 0x12920,   13, 
        0x1e, 0x33, 0xf3, 0x7e, 0x7c, 0xfc, 0xfe, 0xff, 0xf2, 0xef, 0xdf, 0xbe, 0xbc);
    vpatch(rom, 0x12950,   16, 
        0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
        0x00, 0x00, 0x00, 0x00);
    vpatch(rom, 0x12970,  144, 
        0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
        0x00, 0x00, 0x00, 0x00, 0x3f, 0x7f, 0x3f, 0x3b, 0x39, 0x15, 0x17, 0x3f,
        0x3f, 0x40, 0x20, 0x27, 0x27, 0x1b, 0x18, 0x3c, 0x3c, 0x7e, 0xff, 0xff,
        0xff, 0xff, 0xff, 0xff, 0x7e, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff,
        0x7e, 0x7e, 0xfe, 0xef, 0xff, 0xd3, 0xf3, 0xf1, 0x53, 0x69, 0x99, 0xa9,
        0x3c, 0x5f, 0x7f, 0xff, 0xff, 0x7e, 0x00, 0xfe, 0x00, 0x00, 0x00, 0x00,
        0xff, 0xff, 0xfe, 0xff, 0xff, 0x00, 0x00, 0x00, 0xfe, 0xff, 0xff, 0xe7,
        0xd5, 0xdf, 0x7f, 0x7f, 0xfe, 0x01, 0x0c, 0x1f, 0xaf, 0xa1, 0x79, 0x47,
        0x3c, 0x7e, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0x7e, 0xff, 0xff, 0xff,
        0xff, 0xff, 0xff, 0xff, 0xff, 0x7e, 0xfe, 0xff, 0xfc, 0x72, 0x32, 0x71,
        0x85, 0x45, 0xb3, 0x8f, 0x3c, 0xce, 0xee, 0xff, 0xff, 0x7e, 0x00, 0xfe,
        0x00, 0x00, 0x00, 0x00, 0xff, 0xff, 0xff, 0xfe, 0xfe, 0xff, 0x00, 0x00);
    vpatch(rom, 0x12a20,  288, 
        0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
        0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
        0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
        0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
        0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
        0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
        0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
        0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
        0x34, 0x59, 0xe7, 0xdf, 0xff, 0xff, 0xff, 0xff, 0x3e, 0x7f, 0xff, 0xfd,
        0xfd, 0xf5, 0xf5, 0xe5, 0xff, 0xff, 0xff, 0xff, 0xff, 0xe7, 0xab, 0xfb,
        0x7f, 0x80, 0x00, 0x00, 0xb0, 0xf8, 0xf5, 0x85, 0xff, 0xe3, 0x67, 0x30,
        0x18, 0x01, 0x07, 0x00, 0xf1, 0xfe, 0x78, 0x5f, 0x2f, 0x3f, 0x00, 0x00,
        0xe2, 0xe3, 0xd1, 0x4c, 0xe2, 0xf2, 0x10, 0xa0, 0xfe, 0x7f, 0x7f, 0xff,
        0x9f, 0xff, 0xff, 0x7f, 0x34, 0x59, 0xe7, 0xdf, 0xff, 0xff, 0xff, 0xff,
        0x3e, 0x7f, 0xff, 0xfb, 0xfb, 0xf5, 0xe5, 0xc4, 0xff, 0xff, 0xff, 0xff,
        0xff, 0xe7, 0xab, 0xfb, 0x7f, 0x80, 0x00, 0x00, 0xb0, 0xf8, 0xf5, 0x85,
        0xff, 0xcf, 0x07, 0x04, 0x0f, 0x1f, 0x06, 0x00, 0xe1, 0xf9, 0x7f, 0x7f,
        0x39, 0x21, 0x01, 0x01, 0x00, 0xc1, 0x30, 0x88, 0x44, 0x24, 0x24, 0x24,
        0xfe, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0x34, 0x59, 0xe7, 0xdf,
        0xff, 0xff, 0xff, 0xff, 0x3e, 0x7f, 0xff, 0xfd, 0xfd, 0xf5, 0xf5, 0xe5,
        0xe0, 0xf0, 0xf4, 0xf8, 0x8a, 0x3c, 0x68, 0x58, 0x40, 0x10, 0x14, 0x08,
        0x7a, 0xfc, 0xf8, 0xe8, 0xff, 0xe3, 0x67, 0x30, 0x38, 0x01, 0x02, 0x00,
        0xf1, 0xfe, 0x78, 0x1f, 0x0f, 0x0f, 0x00, 0x00, 0xe0, 0xe2, 0xd1, 0x4c,
        0xe2, 0xf2, 0x90, 0xa0, 0xfc, 0x7e, 0x7f, 0xff, 0x9f, 0xff, 0x7e, 0x7c);
    vpatch(rom, 0x12b4b,  181, 
        0xfb, 0xfb, 0xf5, 0xe5, 0xc5, 0xe0, 0xf0, 0xf4, 0xf8, 0x8a, 0x3c, 0x68,
        0x58, 0x40, 0x10, 0x14, 0x08, 0x7a, 0xfc, 0xf8, 0xe8, 0xff, 0xcf, 0x07,
        0x04, 0x0f, 0x3f, 0x02, 0x00, 0xe0, 0xf9, 0x7f, 0x7f, 0x39, 0x01, 0x01,
        0x01, 0xc1, 0xc1, 0x30, 0x88, 0x44, 0x24, 0x24, 0x24, 0xfe, 0xff, 0xff,
        0xff, 0xff, 0xff, 0xff, 0xff, 0x0f, 0x2f, 0x5f, 0x3f, 0xdf, 0xef, 0x7f,
        0x3f, 0x0b, 0x28, 0x50, 0x30, 0x90, 0x8a, 0x4b, 0x34, 0x40, 0xe0, 0xe0,
        0xe0, 0xe0, 0xe0, 0xe0, 0xfc, 0x40, 0xa0, 0x20, 0x20, 0x20, 0x20, 0x60,
        0x2c, 0x7f, 0x7f, 0xff, 0xff, 0xff, 0x7f, 0x3f, 0x1f, 0x43, 0x40, 0x80,
        0x82, 0x81, 0x40, 0x20, 0x1f, 0xfe, 0xfe, 0xff, 0xff, 0xff, 0xff, 0xff,
        0xc6, 0xc2, 0x02, 0x01, 0x01, 0xf1, 0x01, 0x01, 0xfe, 0x0f, 0x2f, 0x5f,
        0x3f, 0xdf, 0xef, 0x7f, 0x3f, 0x0b, 0x28, 0x50, 0x30, 0x90, 0x8a, 0x4b,
        0x34, 0x40, 0xe0, 0xe0, 0xe0, 0xe0, 0xe0, 0xe0, 0xfc, 0x40, 0xa0, 0x20,
        0x20, 0x20, 0x20, 0x60, 0x2c, 0x7f, 0x7f, 0xff, 0xff, 0xff, 0xff, 0xff,
        0x63, 0x43, 0x40, 0x80, 0x80, 0x8f, 0x80, 0x9c, 0x7f, 0xfe, 0xfe, 0xff,
        0xff, 0xff, 0xfe, 0xfc, 0xf8, 0xc2, 0x02, 0x01, 0x41, 0x81, 0x02, 0x04, 0xf8);
    vpatch(rom, 0x12c44,   78, 
        0x3f, 0x7f, 0x7f, 0x7f, 0x38, 0x3c, 0x1f, 0x1f, 0x0f, 0x10, 0x10, 0x48,
        0x3e, 0x79, 0xf7, 0xf1, 0xf9, 0xfd, 0xff, 0xfe, 0x38, 0x7a, 0xf0, 0xf0,
        0xe0, 0x10, 0x10, 0x24, 0x7f, 0xff, 0xff, 0x3f, 0x3f, 0x3f, 0x7f, 0xff,
        0x64, 0xff, 0xff, 0xff, 0xff, 0x3f, 0x7f, 0xff, 0xfc, 0xfe, 0xfe, 0xfa,
        0xfa, 0xfa, 0xfe, 0x86, 0x4f, 0xff, 0xfe, 0xf8, 0xf8, 0xf8, 0xfc, 0xfe,
        0x38, 0x7e, 0xf1, 0xf7, 0xf9, 0xfd, 0xfd, 0xff, 0x38, 0x78, 0xf2, 0xf0,
        0xe0, 0x10, 0x10, 0x24, 0x3f, 0x7f);
    vpatch(rom, 0x12c97,    3, 
        0xe1, 0xe4, 0xff);
    vpatch(rom, 0x12c9f,   35, 
        0xff, 0xfe, 0xfc, 0xfe, 0xfe, 0xfa, 0xfa, 0xfe, 0xfe, 0x4c, 0xff, 0xff,
        0xfe, 0xf8, 0xf8, 0xfc, 0xfe, 0x80, 0xc0, 0xe0, 0xb0, 0x90, 0xe0, 0xe0,
        0x80, 0x00, 0x40, 0x60, 0xf0, 0xf0, 0x50, 0x70, 0x70, 0x0e, 0x0e);
    vpatch(rom, 0x12cc7,    3, 
        0x61, 0x01, 0x0f);
    vpatch(rom, 0x12ccf,   52, 
        0x7f, 0x50, 0x60, 0xf0, 0xf0, 0xf0, 0xf0, 0xf8, 0xf8, 0xf0, 0xb0, 0x50,
        0x68, 0x68, 0x70, 0x78, 0xf8, 0x0f, 0x07, 0x03, 0x07, 0x1f, 0x3f, 0x3f,
        0x1f, 0x0f, 0x07, 0x02, 0x06, 0x06, 0x16, 0x0e, 0x03, 0x00, 0xc0, 0xe0,
        0xb0, 0x90, 0x60, 0xe0, 0x80, 0x00, 0x40, 0x60, 0x70, 0xf0, 0xd0, 0x70,
        0x70, 0x0f, 0x0e, 0x1e);
    vpatch(rom, 0x12d08,    3, 
        0x00, 0x0f, 0x1f);
    vpatch(rom, 0x12d10,  112, 
        0xc0, 0x60, 0x70, 0xf0, 0xf0, 0xf0, 0xf8, 0x88, 0x70, 0xb0, 0xd0, 0x68,
        0x68, 0x70, 0x78, 0x78, 0x7c, 0x9e, 0xef, 0x8d, 0x9c, 0xbb, 0xfb, 0x7c,
        0x1c, 0x5e, 0x0f, 0x0f, 0x07, 0x1e, 0x0f, 0x07, 0x1c, 0x3c, 0xf8, 0xd8,
        0x9c, 0x6e, 0x6e, 0x1e, 0x1c, 0x3c, 0xf8, 0xf8, 0xf0, 0xbc, 0xf8, 0xf0,
        0x3d, 0x3e, 0x5f, 0x5f, 0x5f, 0x5f, 0x7f, 0x7f, 0xe7, 0xfb, 0x1d, 0x1e,
        0x1e, 0x1f, 0x3f, 0x7f, 0xde, 0x3f, 0xff, 0x7c, 0x7c, 0xfc, 0xfe, 0x87,
        0xf2, 0xef, 0xdf, 0xbf, 0xbf, 0xfc, 0xfe, 0xff, 0x1c, 0x7e, 0x8f, 0xed,
        0x9c, 0xbb, 0xbb, 0xfc, 0x1c, 0x1e, 0x4f, 0x0f, 0x07, 0x1e, 0x0f, 0x07,
        0x7c, 0x3e, 0x3f, 0x5f, 0x5f, 0x5f, 0x7f, 0x61, 0x27, 0xfb, 0xfd, 0x1e,
        0x1e, 0x1f, 0x3f, 0x3f);
    set_palette_colors(rom, 0, 0x01, 0x35, 0x0f);
}